

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_v4_serial.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  void *pvVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var2
  ;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  col_coo;
  pointer pdVar3;
  int iVar4;
  uint32_t uVar5;
  FILE *__stream;
  pointer puVar6;
  ostream *poVar8;
  char *pcVar9;
  uint32_t *puVar10;
  long lVar11;
  allocator_type *paVar12;
  int *piVar13;
  int *piVar14;
  int *piVar15;
  uint uVar16;
  ulong uVar17;
  int *piVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  allocator_type *paVar24;
  allocator_type *paVar25;
  pointer pdVar26;
  allocator_type *paVar27;
  allocator_type *paVar28;
  allocator_type *paVar29;
  int *unaff_R15;
  int *piVar30;
  int nnz;
  int N;
  MM_typecode matcode;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cscRow;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cscColumn;
  int M;
  vector<unsigned_int,_std::allocator<unsigned_int>_> k;
  vector<unsigned_int,_std::allocator<unsigned_int>_> temp1;
  vector<int,_std::allocator<int>_> result_vector;
  vector<unsigned_int,_std::allocator<unsigned_int>_> l;
  vector<int,_std::allocator<int>_> ones;
  uint local_190;
  uint local_18c;
  int *local_188;
  char local_17c;
  char local_17b;
  char local_17a;
  vector<double,_std::allocator<double>_> local_178;
  pointer local_160;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_158;
  allocator_type local_139;
  pointer local_138;
  pointer pdStack_130;
  pointer local_128;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_118;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Stack_110;
  pointer local_108;
  int *local_100;
  uint local_f4;
  pointer local_f0;
  int *local_e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e0;
  vector<int,_std::allocator<int>_> local_c8;
  void *local_b0;
  void *local_a8;
  long local_a0;
  vector<int,_std::allocator<int>_> local_98;
  pointer local_80;
  int *local_78;
  void *local_70;
  void *local_68;
  long local_60;
  vector<int,_std::allocator<int>_> local_58;
  long local_40;
  long local_38;
  allocator_type *paVar7;
  
  local_108 = (pointer)0x0;
  local_118._M_current = (uint *)0x0;
  _Stack_110._M_current = (uint *)0x0;
  local_128 = (pointer)0x0;
  local_138 = (pointer)0x0;
  pdStack_130 = (pointer)0x0;
  if (argc < 2) {
LAB_00102fb6:
    main_cold_1();
  }
  else {
    __stream = fopen(argv[1],"r");
    if (__stream == (FILE *)0x0) goto LAB_00102ff5;
    iVar4 = mm_read_banner((FILE *)__stream,(MM_typecode *)&local_17c);
    if (iVar4 == 0) {
      if (((local_17a == 'C') && (local_17c == 'M')) && (local_17b == 'C')) {
        printf("Sorry, this application does not support ");
        pcVar9 = mm_typecode_to_str(&local_17c);
        printf("Market Market type: [%s]\n",pcVar9);
      }
      else {
        iVar4 = mm_read_mtx_crd_size
                          ((FILE *)__stream,(int *)&local_f4,(int *)&local_18c,(int *)&local_190);
        if (iVar4 == 0) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_178,
                     (long)(int)local_190,(allocator_type *)&local_158);
          pdVar26 = local_108;
          _Var2._M_current = local_118._M_current;
          local_118._M_current =
               (uint *)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          _Stack_110._M_current =
               (uint *)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish;
          local_108 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (((pointer)_Var2._M_current != (pointer)0x0) &&
             (operator_delete(_Var2._M_current,(long)pdVar26 - (long)_Var2._M_current),
             local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start != (pointer)0x0)) {
            operator_delete(local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_178,
                     (long)(int)local_190,(allocator_type *)&local_158);
          pdVar3 = local_128;
          pdVar26 = local_138;
          local_138 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
          pdStack_130 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish;
          local_128 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((pdVar26 != (pointer)0x0) &&
             (operator_delete(pdVar26,(long)pdVar3 - (long)pdVar26),
             local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start != (pointer)0x0)) {
            operator_delete(local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_178,(long)(int)local_190,(allocator_type *)&local_158);
          local_f0 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          local_80 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_178,
                     (long)(int)local_190 * 2,(allocator_type *)&local_158);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_158,(long)(int)local_18c + 1,(allocator_type *)&local_b0);
          if (local_17a == 'P') {
            if (local_190 != 0) {
              unaff_R15 = (int *)0x0;
              uVar17 = 0;
              do {
                __isoc99_fscanf(__stream,"%d %d\n",(long)local_118._M_current + (long)unaff_R15,
                                (long)local_138 + (long)unaff_R15);
                *(undefined8 *)((long)local_f0 + (long)unaff_R15 * 2) = 0x3ff0000000000000;
                *(int *)((long)local_118._M_current + (long)unaff_R15) =
                     *(int *)((long)local_118._M_current + (long)unaff_R15) + -1;
                *(int *)((long)local_138 + (long)unaff_R15) =
                     *(int *)((long)local_138 + (long)unaff_R15) + -1;
                uVar17 = uVar17 + 1;
                unaff_R15 = unaff_R15 + 1;
              } while (uVar17 < local_190);
            }
          }
          else if (local_190 != 0) {
            lVar11 = 0;
            unaff_R15 = (int *)0x0;
            pdVar26 = local_f0;
            do {
              __isoc99_fscanf(__stream,"%d %d %lg\n",(long)local_118._M_current + lVar11,
                              (long)local_138 + lVar11,pdVar26);
              *(int *)((long)local_118._M_current + lVar11) =
                   *(int *)((long)local_118._M_current + lVar11) + -1;
              *(int *)((long)local_138 + lVar11) = *(int *)((long)local_138 + lVar11) + -1;
              unaff_R15 = (int *)((long)unaff_R15 + 1);
              lVar11 = lVar11 + 4;
              pdVar26 = pdVar26 + 1;
            } while (unaff_R15 < (int *)(ulong)local_190);
          }
          if (__stream != _stdin) {
            fclose(__stream);
          }
          if (local_f4 != local_18c) {
            printf("COO matrix\' columns and rows are not the same");
          }
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_b0,local_118,
                     _Stack_110,(allocator_type *)&local_c8);
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_118,
                     _Stack_110._M_current,local_138,pdStack_130);
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_138,pdStack_130,
                     local_b0,local_a8);
          if (local_a8 != local_b0) {
            local_a8 = local_b0;
          }
          puVar10 = &local_18c;
          _Var2._M_current = (uint *)local_138;
          col_coo._M_current = local_118._M_current;
          if (*local_118._M_current < *(uint *)local_138) {
            puVar10 = &local_f4;
            _Var2._M_current = local_118._M_current;
            col_coo._M_current = (uint *)local_138;
          }
          coo2csc((uint32_t *)
                  local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start,_Var2._M_current,col_coo._M_current,local_190 * 2
                  ,*puVar10,0);
          local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (int *)0x0;
          local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (int *)0x0;
          local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start._0_4_ = 1;
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_58,(long)(int)local_18c,(value_type_conflict2 *)&local_98,
                     (allocator_type *)&local_e0);
          local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0;
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_98,(long)(int)local_18c,(value_type_conflict2 *)&local_e0,
                     (allocator_type *)&local_70);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_e0,(long)(int)local_190 * 2,(allocator_type *)&local_70);
          puVar6 = local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          piVar15 = (int *)CONCAT44(local_e0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (int)local_e0.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
          local_160 = local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_38 = std::chrono::_V2::system_clock::now();
          local_188 = piVar15;
          if (local_18c != 0) {
            local_40 = (long)puVar6 - (long)piVar15;
            local_78 = (int *)(local_40 >> 2);
            uVar19 = 0;
            puVar6 = local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            puVar10 = local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              piVar14 = (int *)(ulong)(uVar19 + 1);
              piVar13 = (int *)((long)puVar6 - (long)puVar10 >> 2);
              if (piVar13 <= piVar14) {
LAB_00102ef1:
                do {
                  piVar18 = local_188;
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,piVar14);
LAB_00102f0a:
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,unaff_R15);
LAB_00102f18:
                  std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
                  piVar14 = piVar18;
LAB_00102f2c:
                  unaff_R15 = local_188;
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,piVar14);
LAB_00102ed8:
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,unaff_R15);
                  piVar14 = piVar15;
                } while( true );
              }
              piVar15 = (int *)(ulong)uVar19;
              local_100 = (int *)(long)(int)(uVar19 + 1);
              piVar18 = (int *)(long)(int)uVar19;
              paVar27 = (allocator_type *)0x0;
              local_e8 = piVar14;
              while( true ) {
                piVar14 = piVar15;
                if (piVar13 <= piVar15) goto LAB_00102ef1;
                uVar19 = (uint)paVar27;
                if (puVar10[(long)local_e8] - puVar10[(long)piVar15] <= uVar19) break;
                uVar17 = (ulong)(puVar10[(long)piVar15] + uVar19);
                if ((ulong)((long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar17)
                goto LAB_00102f18;
                piVar30 = (int *)(long)(int)*(uint32_t *)
                                             ((long)local_178.
                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                             uVar17 * 4);
                unaff_R15 = (int *)((long)piVar30 + 1U);
                if (piVar13 <= (int *)((long)piVar30 + 1U)) goto LAB_00102f0a;
                unaff_R15 = piVar30;
                if (piVar13 <= piVar30) goto LAB_00102f0a;
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                          (&local_e0,(ulong)(puVar10[(long)piVar30 + 1] - puVar10[(long)piVar30]),
                           (allocator_type *)&local_70);
                piVar13 = (int *)((long)local_158.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_158.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2);
                piVar14 = local_100;
                if (piVar13 <= local_100) goto LAB_00102f2c;
                piVar14 = piVar18;
                if (piVar13 <= piVar18) goto LAB_00102f2c;
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,
                           (ulong)(local_158.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[(long)local_100] -
                                  local_158.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[(long)piVar18]),
                           &local_139);
                puVar6 = (pointer)CONCAT44(local_e0.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           (int)local_e0.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                lVar11 = (long)local_e0.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 2;
                if (local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish != puVar6) {
                  if ((int *)((long)local_158.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_158.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2) <= piVar30)
                  goto LAB_00102ed8;
                  lVar22 = 0;
                  do {
                    unaff_R15 = (int *)(ulong)(local_158.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_start
                                               [(long)piVar30] + (int)lVar22);
                    if ((int *)((long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 2) <= unaff_R15)
                    goto LAB_00102ed8;
                    puVar6[lVar22] =
                         *(uint32_t *)
                          ((long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start + (long)unaff_R15 * 4);
                    lVar22 = lVar22 + 1;
                  } while (lVar11 + (ulong)(lVar11 == 0) != lVar22);
                }
                lVar22 = (long)local_68 - (long)local_70 >> 2;
                paVar28 = (allocator_type *)&local_70;
                if (local_68 != local_70) {
                  unaff_R15 = piVar18;
                  if ((int *)((long)local_158.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_158.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2) <= piVar18)
                  goto LAB_00102ed8;
                  paVar28 = (allocator_type *)0x0;
                  do {
                    unaff_R15 = (int *)(ulong)(local_158.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_start
                                               [(long)piVar18] + (int)paVar28);
                    if ((int *)((long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 2) <= unaff_R15)
                    goto LAB_00102ed8;
                    uVar16 = *(uint *)((long)local_178.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start +
                                      (long)unaff_R15 * 4);
                    piVar30 = (int *)(ulong)uVar16;
                    *(uint *)((long)local_70 + (long)paVar28 * 4) = uVar16;
                    paVar28 = paVar28 + 1;
                  } while ((allocator_type *)(lVar22 + (ulong)(lVar22 == 0)) != paVar28);
                }
                if (local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish != puVar6) {
                  lVar23 = 0;
                  iVar20 = 0;
                  iVar4 = 0;
                  iVar21 = 0;
                  do {
                    if (lVar22 == iVar4) break;
                    uVar16 = *(uint *)((long)local_70 + (long)iVar4 * 4);
                    if (puVar6[lVar23] == uVar16) {
                      iVar20 = iVar20 + 1;
                      iVar21 = iVar21 + 1;
LAB_00102ad9:
                      iVar4 = iVar4 + 1;
                    }
                    else {
                      if (uVar16 < puVar6[lVar23]) goto LAB_00102ad9;
                      iVar21 = iVar21 + 1;
                    }
                    lVar23 = (long)iVar21;
                  } while (lVar11 != lVar23);
                  if (iVar20 != 0) {
                    piVar14 = (int *)((long)local_158.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_158.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 2);
                    piVar13 = piVar15;
                    if ((piVar14 <= piVar15) ||
                       (piVar13 = (int *)(ulong)(local_158.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start
                                                 [(long)piVar15] + uVar19), piVar14 = local_78,
                       local_78 <= piVar13)) {
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,piVar13,piVar14);
                      goto LAB_00102f87;
                    }
                    local_188[(long)piVar13] = iVar20;
                  }
                }
                if (local_70 != (void *)0x0) {
                  operator_delete(local_70,local_60 - (long)local_70);
                  puVar6 = (pointer)CONCAT44(local_e0.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             (int)local_e0.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                if (puVar6 != (pointer)0x0) {
                  operator_delete(puVar6,(long)local_e0.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                         (long)puVar6);
                }
                paVar27 = (allocator_type *)(ulong)(uVar19 + 1);
                piVar13 = (int *)((long)local_158.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_158.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2);
                puVar6 = local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                puVar10 = local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                piVar14 = local_e8;
                unaff_R15 = piVar30;
                if (piVar13 <= local_e8) goto LAB_00102ef1;
              }
              uVar19 = (uint)local_e8;
            } while (uVar19 < local_18c);
            if (local_18c != 0) {
              local_e8 = (int *)((long)local_158.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_158.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2);
              piVar15 = (int *)0x0;
LAB_00102bcd:
              uVar19 = (int)piVar15 + 1;
              piVar14 = (int *)(ulong)uVar19;
              if (piVar14 < local_e8) {
                local_100 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                uVar5 = local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[(long)piVar15];
                if (local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)piVar14] == uVar5)
                goto LAB_00102c8d;
                paVar12 = (allocator_type *)
                          ((long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2);
                paVar24 = (allocator_type *)(long)(int)piVar15;
                paVar25 = (allocator_type *)
                          ((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2);
                paVar29 = (allocator_type *)
                          ((long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           CONCAT44(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_,
                                    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_4_) >> 2);
                uVar16 = 0;
                while (paVar7 = (allocator_type *)(ulong)(uVar5 + uVar16), paVar7 < paVar12) {
                  paVar27 = paVar7;
                  paVar28 = (allocator_type *)(local_40 >> 2);
                  if ((((allocator_type *)(local_40 >> 2) <= paVar7) ||
                      (paVar27 = paVar24, paVar28 = paVar25, paVar25 <= paVar24)) ||
                     (paVar27 = (allocator_type *)
                                (long)(int)*(uint32_t *)
                                            ((long)local_178.
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                            (long)paVar7 * 4), paVar28 = paVar29, paVar29 <= paVar27
                     )) goto LAB_00102f87;
                  piVar13 = (int *)(CONCAT44(local_98.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                                             local_98.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                   (long)paVar27 * 4);
                  *piVar13 = *piVar13 +
                             local_188[(long)paVar7] *
                             local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[(long)paVar24];
                  uVar16 = uVar16 + 1;
                  uVar5 = local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[(long)piVar15];
                  if (local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[(long)piVar14] - uVar5 <= uVar16)
                  goto LAB_00102c8d;
                }
                paVar27 = paVar24;
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,paVar7,paVar12);
                paVar28 = paVar25;
LAB_00102f87:
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,paVar27,paVar28);
              }
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
              goto LAB_00102fb6;
            }
          }
          local_100 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
LAB_00102ca9:
          piVar13 = local_100;
          piVar14 = local_188;
          piVar15 = (int *)CONCAT44(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_,
                                    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_4_);
          if (piVar15 != local_100) {
            do {
              local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = *piVar15 / 2;
              if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&local_c8,
                           (iterator)
                           local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_e0);
              }
              else {
                *local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish =
                     (int)local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              piVar15 = piVar15 + 1;
            } while (piVar15 != piVar13);
          }
          lVar11 = std::chrono::_V2::system_clock::now();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Took ",5);
          poVar8 = std::ostream::_M_insert<double>((double)(lVar11 - local_38) / 1000000000.0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
          std::ostream::put(-0x38);
          std::ostream::flush();
          pvVar1 = (void *)CONCAT44(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_,
                                    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_4_);
          if (pvVar1 != (void *)0x0) {
            operator_delete(pvVar1,(long)local_98.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pvVar1);
          }
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_b0 != (void *)0x0) {
            operator_delete(local_b0,local_a0 - (long)local_b0);
          }
          if (piVar14 != (int *)0x0) {
            operator_delete(piVar14,(long)local_160 - (long)piVar14);
          }
          if (local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint32_t *)0x0) {
            operator_delete(local_158.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_158.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_158.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_f0 != (pointer)0x0) {
            operator_delete(local_f0,(long)local_80 - (long)local_f0);
          }
          if (local_138 != (pointer)0x0) {
            operator_delete(local_138,(long)local_128 - (long)local_138);
          }
          if ((pointer)local_118._M_current != (pointer)0x0) {
            operator_delete(local_118._M_current,(long)local_108 - (long)local_118._M_current);
          }
          return 0;
        }
      }
      goto LAB_00102ff5;
    }
  }
  puts("Could not process Matrix Market banner.");
LAB_00102ff5:
  exit(1);
LAB_00102c8d:
  piVar15 = piVar14;
  if (local_18c <= uVar19) goto LAB_00102ca9;
  goto LAB_00102bcd;
}

Assistant:

int main(int argc, char** argv){
    int ret_code;
    MM_typecode matcode;
    FILE *f;
    int M, N, nnz;
    uint32_t i;
    std::vector<uint32_t> I, J;
    std::vector<double> val;

    if (argc < 2)
    {
        fprintf(stderr, "Usage: %s [martix-market-filename] [0 for binary or 1 for non binary]\n", argv[0]);
        exit(1);
    }
    else
    {
        if ((f = fopen(argv[1], "r")) == nullptr)
            exit(1);
    }

    if (mm_read_banner(f, &matcode) != 0)
    {
        printf("Could not process Matrix Market banner.\n");
        exit(1);
    }


    /*  This is how one can screen matrix types if their application */
    /*  only supports a subset of the Matrix Market data types.      */

    if (mm_is_complex(matcode) && mm_is_matrix(matcode) &&
        mm_is_sparse(matcode) )
    {
        printf("Sorry, this application does not support ");
        printf("Market Market type: [%s]\n", mm_typecode_to_str(matcode));
        exit(1);
    }

    /* find out size of sparse matrix .... */

    if ((ret_code = mm_read_mtx_crd_size(f, &M, &N, &nnz)) != 0)
        exit(1);


    I = std::vector<uint32_t>(nnz);
    J = std::vector<uint32_t>(nnz);
    val = std::vector<double>(nnz);

    std::vector<uint32_t> cscRow = std::vector<uint32_t>(2*nnz);
    std::vector<uint32_t> cscColumn = std::vector<uint32_t>(N+1);
    std::vector<uint32_t> c_values = std::vector<uint32_t>(0);

    /* NOTE: when reading in doubles, ANSI C requires the use of the "l"  */
    /*   specifier as in "%lg", "%lf", "%le", otherwise errors will occur */
    /*  (ANSI C X3.159-1989, Sec. 4.9.6.2, p. 136 lines 13-15)            */

    /* Replace missing val column with 1s and change the fscanf to match pattern matrices*/

    if (!mm_is_pattern(matcode)) {
        for (i = 0; i < nnz; i++) {
            fscanf(f, "%d %d %lg\n", &I[i], &J[i], &val[i]);
            I[i]--;  /* adjust from 1-based to 0-based */
            J[i]--;
        }
    } else {
        for (i = 0; i < nnz; i++) {
            fscanf(f, "%d %d\n", &I[i], &J[i]);
            val[i] = 1;
            I[i]--;  /* adjust from 1-based to 0-based */
            J[i]--;
        }
    }

    if (f !=stdin) fclose(f);

    if(M != N) {
        printf("COO matrix' columns and rows are not the same");
    }

    // create symmetric values
    std::vector<uint32_t> temp1 = std::vector<uint32_t>(I.begin(), I.end());
    I.insert(std::end(I), std::begin(J), std::end(J));
    J.insert(std::end(J), std::begin(temp1), std::end(temp1));
    temp1.clear();

    if (I[0] < J[0]) {
        coo2csc(&cscRow[0], &cscColumn[0], &I[0], &J[0], 2 * nnz, M, 0);
    } else {
        coo2csc(&cscRow[0], &cscColumn[0], &J[0], &I[0], 2 * nnz, N, 0);
    }

    std::vector<int>c3 = std::vector<int>(0);
    std::vector<int>ones = std::vector<int>(N, 1);
    std::vector<int>result_vector = std::vector<int>(N, 0);
    c_values = std::vector<uint32_t>(2*nnz);

    auto start = std::chrono::high_resolution_clock::now();

    for(i = 0; i < N; i++) {
        for(int j = 0; j < cscColumn.at(i+1) - cscColumn.at(i); j++) {
            int a_row = cscRow.at(cscColumn.at(i) + j);
            int a_col = i;

            std::vector<uint32_t> k = std::vector<uint32_t>(cscColumn.at(a_row+1) - cscColumn.at(a_row));
            std::vector<uint32_t> l = std::vector<uint32_t>(cscColumn.at(a_col+1) - cscColumn.at(a_col));

            int s;
            for(s = 0; s < k.size(); ++s) {
                k[s] = cscRow.at(cscColumn.at(a_row) + s);
            }
            for(s = 0; s < l.size(); ++s) {
                l[s] = cscRow.at(cscColumn.at(a_col) + s);
            }

            int m = 0;
            int n = 0;
            int mul_value = 0;

            while(m != k.size() && n != l.size()) {
                if(k[m] == l[n]) {
                    ++mul_value;
                    ++m;
                    ++n;
                } else if(k[m] > l[n]) {
                    ++n;
                } else{
                    ++m;
                }
            }

            if(mul_value) {
                c_values.at(cscColumn.at(i) + j) = mul_value;
            }
        }
    }

    for(i = 0; i < N; i++) {
        for(int j = 0; j < cscColumn.at(i+1) - cscColumn.at(i); j++) {
            int row = cscRow.at(cscColumn.at(i) + j);
            int col = i;
            int value = c_values.at(cscColumn.at(i) + j);
            result_vector.at(row) += value * ones.at(col);
        }
    }

    for(int res: result_vector){
        c3.push_back(res/2);
    }

    auto stop = std::chrono::high_resolution_clock::now();

    std::chrono::duration<double> elapsed = stop - start;
    std::cout<<"Took "<< elapsed.count() <<std::endl;

//    for(int item: c3){
//        std::cout<< item << " ";
//    }
    std::cout<<std::endl;

    return 0;
}